

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLEntityDecl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLEntityDecl::XMLEntityDecl(XMLEntityDecl *this,XMLCh *entName,MemoryManager *manager)

{
  XMLCh *pXVar1;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XMLEntityDecl_004010c8;
  this->fId = 0;
  this->fValueLen = 0;
  this->fValue = (XMLCh *)0x0;
  this->fName = (XMLCh *)0x0;
  this->fNotationName = (XMLCh *)0x0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fBaseURI = (XMLCh *)0x0;
  this->fIsExternal = false;
  this->fMemoryManager = manager;
  pXVar1 = XMLString::replicate(entName,manager);
  this->fName = pXVar1;
  return;
}

Assistant:

XMLEntityDecl::XMLEntityDecl(const XMLCh* const entName,
                             MemoryManager* const manager) :

    fId(0)
    , fValueLen(0)
    , fValue(0)
    , fName(0)
    , fNotationName(0)
    , fPublicId(0)
    , fSystemId(0)
    , fBaseURI(0)
    , fIsExternal(false)
    , fMemoryManager(manager)
{
    fName = XMLString::replicate(entName, fMemoryManager);
}